

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

bool CheckFinalTxAtTip(CBlockIndex *active_chain_tip,CTransaction *tx)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  int64_t nBlockTime;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = active_chain_tip->nHeight;
  nBlockTime = CBlockIndex::GetMedianTimePast(active_chain_tip);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    bVar3 = IsFinalTx(tx,iVar1 + 1,nBlockTime);
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool CheckFinalTxAtTip(const CBlockIndex& active_chain_tip, const CTransaction& tx)
{
    AssertLockHeld(cs_main);

    // CheckFinalTxAtTip() uses active_chain_tip.Height()+1 to evaluate
    // nLockTime because when IsFinalTx() is called within
    // AcceptBlock(), the height of the block *being*
    // evaluated is what is used. Thus if we want to know if a
    // transaction can be part of the *next* block, we need to call
    // IsFinalTx() with one more than active_chain_tip.Height().
    const int nBlockHeight = active_chain_tip.nHeight + 1;

    // BIP113 requires that time-locked transactions have nLockTime set to
    // less than the median time of the previous block they're contained in.
    // When the next block is created its previous block will be the current
    // chain tip, so we use that to calculate the median time passed to
    // IsFinalTx().
    const int64_t nBlockTime{active_chain_tip.GetMedianTimePast()};

    return IsFinalTx(tx, nBlockHeight, nBlockTime);
}